

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_io.cc
# Opt level: O2

void core::image::save_file(ConstPtr *image,string *filename)

{
  bool bVar1;
  Exception *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  __shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2> local_c8;
  __shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2> local_b8;
  __shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2> local_a8;
  __shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2> local_98;
  undefined1 local_88 [8];
  string fext4;
  undefined1 local_48 [8];
  string fext5;
  
  util::string::right((string *)local_48,filename,4);
  util::string::lowercase((string *)local_88,(string *)local_48);
  std::__cxx11::string::~string((string *)local_48);
  util::string::right((string *)((long)&fext4.field_2 + 8),filename,5);
  util::string::lowercase((string *)local_48,(string *)((long)&fext4.field_2 + 8));
  std::__cxx11::string::~string((string *)(fext4.field_2._M_local_buf + 8));
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_88,".jpg");
  if (!bVar1) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_48,".jpeg");
    if (!bVar1) {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_88,".png");
      if (bVar1) {
        std::__shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr(&local_b8,
                     &image->
                      super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
                    );
        save_png_file((ConstPtr *)&local_b8,filename,1);
        this_00 = &local_b8._M_refcount;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_88,".tif");
        if (!bVar1) {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_48,".tiff");
          if (!bVar1) {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_88,".ppm");
            if (!bVar1) {
              this = (Exception *)__cxa_allocate_exception(0x28);
              std::__cxx11::string::string
                        ((string *)(fext4.field_2._M_local_buf + 8),"Output filetype not supported",
                         (allocator *)(fext5.field_2._M_local_buf + 0xf));
              util::Exception::Exception(this,(string *)((long)&fext4.field_2 + 8));
              __cxa_throw(this,&util::Exception::typeinfo,util::Exception::~Exception);
            }
            std::__shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr(&local_98,
                         &image->
                          super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
                        );
            save_ppm_file((ConstPtr *)&local_98,filename);
            this_00 = &local_98._M_refcount;
            goto LAB_0010db64;
          }
        }
        std::__shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr(&local_a8,
                     &image->
                      super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
                    );
        save_tiff_file((ConstPtr *)&local_a8,filename);
        this_00 = &local_a8._M_refcount;
      }
      goto LAB_0010db64;
    }
  }
  std::__shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_c8,
             &image->
              super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>);
  save_jpg_file((ConstPtr *)&local_c8,filename,0x55);
  this_00 = &local_c8._M_refcount;
LAB_0010db64:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_00);
  std::__cxx11::string::~string((string *)local_48);
  std::__cxx11::string::~string((string *)local_88);
  return;
}

Assistant:

void
save_file (ByteImage::ConstPtr image, std::string const& filename)
{
    using namespace util::string;
    std::string fext4 = lowercase(right(filename, 4));
    std::string fext5 = lowercase(right(filename, 5));

#ifndef MVE_NO_JPEG_SUPPORT
    if (fext4 == ".jpg" || fext5 == ".jpeg")
    {
        save_jpg_file(image, filename, 85);
        return;
    }
#endif

#ifndef MVE_NO_PNG_SUPPORT
    if (fext4 == ".png")
    {
        save_png_file(image, filename);
        return;
    }
#endif

#ifndef MVE_NO_TIFF_SUPPORT
    if (fext4 == ".tif" || fext5 == ".tiff")
    {
        save_tiff_file(image, filename);
        return;
    }
#endif

    if (fext4 == ".ppm")
    {
        save_ppm_file(image, filename);
        return;
    }

    throw util::Exception("Output filetype not supported");
}